

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

int long_comp(void *v1,void *v2)

{
  long l2;
  long l1;
  void *v2_local;
  void *v1_local;
  undefined4 local_4;
  
  if (*v1 < *v2) {
    local_4 = -1;
  }
  else if (*v2 < *v1) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int long_comp(const void *v1, const void *v2) {
  long l1 = *(long *)v1, l2 = *(long *)v2;
  if (l1 < l2)
    return -1;
  if (l1 > l2)
    return 1;
  return 0;
}